

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring64_bitmap_range_closed_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  uint16_t uVar1;
  int iVar2;
  ulong in_RDX;
  ulong in_RSI;
  container_t *container;
  uint8_t typecode;
  leaf_t leaf;
  int max_compare_result;
  art_iterator_t it;
  uint16_t max_low16;
  uint8_t max_high48 [6];
  uint16_t min_low16;
  uint8_t min_high48 [6];
  uint64_t cardinality;
  art_key_chunk_t *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffff27;
  art_key_chunk_t *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  leaf_t *local_c0;
  uint64_t local_28;
  uint64_t local_8;
  
  if (in_RDX < in_RSI) {
    local_8 = 0;
  }
  else {
    local_28 = 0;
    uVar1 = split_key(CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
    split_key(CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff18);
    art_lower_bound((art_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
    while ((local_c0 != (leaf_t *)0x0 &&
           (iVar2 = compare_high48((art_key_chunk_t *)
                                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff18), iVar2 < 1))) {
      in_stack_ffffffffffffff27 = get_typecode(*local_c0);
      in_stack_ffffffffffffff18 =
           (art_key_chunk_t *)
           get_container((roaring64_bitmap_t *)
                         CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         (leaf_t)in_stack_ffffffffffffff18);
      if (iVar2 == 0) {
        iVar2 = container_rank(in_stack_ffffffffffffff18,'\0',0);
      }
      else {
        iVar2 = container_get_cardinality(in_stack_ffffffffffffff18,'\0');
      }
      local_28 = (long)iVar2 + local_28;
      iVar2 = compare_high48((art_key_chunk_t *)
                             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff18);
      if ((iVar2 == 0) && (uVar1 != 0)) {
        iVar2 = container_rank(in_stack_ffffffffffffff18,'\0',0);
        local_28 = local_28 - (long)iVar2;
      }
      art_iterator_next((art_iterator_t *)0x141306);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

uint64_t roaring64_bitmap_range_closed_cardinality(const roaring64_bitmap_t *r,
                                                   uint64_t min, uint64_t max) {
    if (min > max) {
        return 0;
    }

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);
        container_t *container = get_container(r, leaf);
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality += container_rank(container, typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality += container_get_cardinality(container, typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -= container_rank(container, typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}